

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::FormattingScene::TransformEnd(FormattingScene *this,FileLoc loc)

{
  undefined1 *puVar1;
  string sStack_28;
  
  puVar1 = &(this->super_SceneRepresentation).field_0xc;
  *(int *)puVar1 = *(int *)puVar1 + -4;
  indent_abi_cxx11_(&sStack_28,this,0);
  Printf<std::__cxx11::string>("%sTransformEnd\n",&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void FormattingScene::TransformEnd(FileLoc loc) {
    catIndentCount -= 4;
    Printf("%sTransformEnd\n", indent());
}